

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O1

bool __thiscall ScapeGoatTree::insertElement(ScapeGoatTree *this,int value)

{
  Node *root;
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Node *node;
  
  node = (Node *)operator_new(0x20);
  node->value = value;
  node->rightChild = (Node *)0x0;
  node->leftChild = (Node *)0x0;
  node->parent = (Node *)0x0;
  iVar2 = addWithDepth(this,node);
  dVar1 = log((double)this->q);
  dVar1 = ceil(dVar1 * 2.4663034623764317);
  if ((int)dVar1 < iVar2) {
    do {
      node = node->parent;
      iVar3 = size(this,node);
      iVar3 = iVar3 * 3;
      root = node->parent;
      iVar4 = size(this,root);
    } while (iVar3 == iVar4 * 2 || SBORROW4(iVar3,iVar4 * 2) != iVar3 + iVar4 * -2 < 0);
    rebuild(this,root);
  }
  return -1 < iVar2;
}

Assistant:

bool ScapeGoatTree::insertElement(int value) {
    /* first do basic insertion keeping track of depth */
    auto *u = new Node(value);
    int d = addWithDepth(u);
    if (d > log32(q)) {
        /* depth exceeded, find scapegoat */
        Node *w = u->parent;
        while (3 * size(w) <= 2 * size(w->parent)) {
            w = w->parent;
        }
        rebuild(w->parent);
    }
    return d >= 0;
}